

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

int google::protobuf::SingleArena_CopyConstructSSO_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<google::protobuf::SingleArena> *this_01;
  TestMetaFactoryBase<bool> *meta_factory;
  allocator<char> local_d9;
  string local_d8;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  CodeLocation local_68;
  allocator<char> local_29;
  string local_28;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"SingleArena",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
             ,&local_89);
  testing::internal::CodeLocation::CodeLocation(&local_68,&local_88,0xb5);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<google::protobuf::SingleArena>(this_00,&local_28,&local_68);
  meta_factory = (TestMetaFactoryBase<bool> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)0x0;
  testing::internal::TestMetaFactory<google::protobuf::SingleArena_CopyConstructSSO_Test>::
  TestMetaFactory((TestMetaFactory<google::protobuf::SingleArena_CopyConstructSSO_Test> *)
                  meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
             ,&local_d9);
  testing::internal::CodeLocation::CodeLocation(&local_b8,&local_d8,0xb5);
  testing::internal::ParameterizedTestSuiteInfo<google::protobuf::SingleArena>::AddTestPattern
            (this_01,"SingleArena","CopyConstructSSO",meta_factory,&local_b8);
  testing::internal::CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  testing::internal::CodeLocation::~CodeLocation(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return 0;
}

Assistant:

TEST_P(SingleArena, CopyConstructSSO) {
  std::string empty;
  auto arena = GetArena();
  ArenaStringPtr field;
  field.InitExternal(&empty);
  field.Set("Hello world", nullptr);

  ArenaStringPtr dst(arena.get(), field);
  EXPECT_EQ(dst.Get(), "Hello world");
  if (arena == nullptr) dst.Destroy();
  field.Destroy();
}